

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void UYVYToYRow_AVX2(uint8_t *src_uyvy,uint8_t *dst_y,int width)

{
  undefined1 (*pauVar1) [32];
  bool bVar2;
  int iVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  
  do {
    auVar4 = *(undefined1 (*) [32])src_uyvy;
    pauVar1 = (undefined1 (*) [32])((long)src_uyvy + 0x20);
    src_uyvy = (uint8_t *)((long)src_uyvy + 0x40);
    auVar4 = vpsrlw_avx2(auVar4,8);
    auVar5 = vpsrlw_avx2(*pauVar1,8);
    auVar4 = vpackuswb_avx2(auVar4,auVar5);
    auVar4 = vpermq_avx2(auVar4,0xd8);
    *(undefined1 (*) [32])dst_y = auVar4;
    dst_y = (uint8_t *)((long)dst_y + 0x20);
    iVar3 = width + -0x20;
    bVar2 = 0x1f < width;
    width = iVar3;
  } while (iVar3 != 0 && bVar2);
  return;
}

Assistant:

void UYVYToYRow_AVX2(const uint8_t* src_uyvy, uint8_t* dst_y, int width) {
  asm volatile(

      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"
      "vmovdqu     0x20(%0),%%ymm1               \n"
      "lea         0x40(%0),%0                   \n"
      "vpsrlw      $0x8,%%ymm0,%%ymm0            \n"
      "vpsrlw      $0x8,%%ymm1,%%ymm1            \n"
      "vpackuswb   %%ymm1,%%ymm0,%%ymm0          \n"
      "vpermq      $0xd8,%%ymm0,%%ymm0           \n"
      "vmovdqu     %%ymm0,(%1)                   \n"
      "lea         0x20(%1),%1                   \n"
      "sub         $0x20,%2                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src_uyvy),  // %0
        "+r"(dst_y),     // %1
        "+r"(width)      // %2
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm5");
}